

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Core.cpp
# Opt level: O0

Context * Rml::GetContext(int index)

{
  bool bVar1;
  int iVar2;
  CoreData *pCVar3;
  pointer ppVar4;
  pointer pCVar5;
  iterator local_38;
  undefined1 local_28 [8];
  iterator it;
  int index_local;
  
  if ((-1 < index) && (it.mInfo._4_4_ = index, iVar2 = GetNumContexts(), index < iVar2)) {
    pCVar3 = ControlledLifetimeResource<Rml::CoreData>::operator->
                       ((ControlledLifetimeResource<Rml::CoreData> *)core_data);
    _local_28 = robin_hood::detail::
                Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::Context,_Rml::Releaser<Rml::Context>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::begin(&pCVar3->contexts);
    ::std::
    advance<robin_hood::detail::Table<true,80ul,std::__cxx11::string,std::unique_ptr<Rml::Context,Rml::Releaser<Rml::Context>>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>::Iter<false>,int>
              ((Iter<false> *)local_28,it.mInfo._4_4_);
    pCVar3 = ControlledLifetimeResource<Rml::CoreData>::operator->
                       ((ControlledLifetimeResource<Rml::CoreData> *)core_data);
    local_38 = robin_hood::detail::
               Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::Context,_Rml::Releaser<Rml::Context>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end(&pCVar3->contexts);
    bVar1 = robin_hood::detail::
            Table<true,80ul,std::__cxx11::string,std::unique_ptr<Rml::Context,Rml::Releaser<Rml::Context>>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
            ::Iter<false>::operator==((Iter<false> *)local_28,&local_38);
    if (!bVar1) {
      ppVar4 = robin_hood::detail::
               Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::Context,_Rml::Releaser<Rml::Context>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::Iter<false>::operator->((Iter<false> *)local_28);
      pCVar5 = ::std::unique_ptr<Rml::Context,_Rml::Releaser<Rml::Context>_>::get(&ppVar4->second);
      return pCVar5;
    }
    return (Context *)0x0;
  }
  return (Context *)0x0;
}

Assistant:

Context* GetContext(int index)
{
	if (index < 0 || index >= GetNumContexts())
		return nullptr;

	auto it = core_data->contexts.begin();
	std::advance(it, index);

	if (it == core_data->contexts.end())
		return nullptr;

	return it->second.get();
}